

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

int Gia_ManHashMux(Gia_Man_t *p,int iCtrl,int iData1,int iData0)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (p->fGiaSimple == 0) {
    iVar1 = iData0;
    if (iData1 < iData0) {
      iCtrl = Abc_LitNot(iCtrl);
      iVar1 = iData1;
      iData1 = iData0;
    }
    uVar3 = Abc_LitIsCompl(iData1);
    if (uVar3 != 0) {
      iVar1 = Abc_LitNot(iVar1);
      iData1 = Abc_LitNot(iData1);
    }
    iVar2 = Abc_LitNot(iCtrl);
    iVar1 = Gia_ManHashAnd(p,iVar2,iVar1);
    iVar2 = Gia_ManHashAnd(p,iCtrl,iData1);
    iVar1 = Abc_LitNot(iVar1);
    iVar2 = Abc_LitNot(iVar2);
    iVar1 = Gia_ManHashAnd(p,iVar1,iVar2);
    iVar1 = Abc_LitNotCond(iVar1,uVar3 ^ 1);
    return iVar1;
  }
  iVar1 = Gia_ManHashAnd(p,iCtrl,iData1);
  iVar2 = Abc_LitNot(iCtrl);
  iVar2 = Gia_ManHashAnd(p,iVar2,iData0);
  iVar1 = Gia_ManHashOr(p,iVar1,iVar2);
  return iVar1;
}

Assistant:

int Gia_ManHashMux( Gia_Man_t * p, int iCtrl, int iData1, int iData0 )  
{ 
    if ( p->fGiaSimple )
        return Gia_ManHashOr(p, Gia_ManHashAnd(p, iCtrl, iData1), Gia_ManHashAnd(p, Abc_LitNot(iCtrl), iData0) );
    else
    {
        int iTemp0, iTemp1, fCompl = 0;
        if ( iData0 > iData1 )
            iData0 ^= iData1, iData1 ^= iData0, iData0 ^= iData1, iCtrl = Abc_LitNot(iCtrl);
        if ( Abc_LitIsCompl(iData1) )
            iData0 = Abc_LitNot(iData0), iData1 = Abc_LitNot(iData1), fCompl = 1;
        iTemp0 = Gia_ManHashAnd( p, Abc_LitNot(iCtrl), iData0 );
        iTemp1 = Gia_ManHashAnd( p, iCtrl, iData1 );
        return Abc_LitNotCond( Gia_ManHashAnd( p, Abc_LitNot(iTemp0), Abc_LitNot(iTemp1) ), !fCompl );
    }
}